

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

self * __thiscall
boost::python::
class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
add_property<std::vector<int,std::allocator<int>>HFParsingInfo::*,std::vector<int,std::allocator<int>>HFParsingInfo::*>
          (class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           *this,char *name,offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> fget,
          offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> fset,char *docstr)

{
  char *in_RSI;
  class_base *in_RDI;
  char *in_R8;
  offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> in_stack_ffffffffffffffc0;
  object_base in_stack_ffffffffffffffc8;
  object local_30;
  char *local_28;
  
  local_28 = in_R8;
  make_getter<std::vector<int,std::allocator<int>>HFParsingInfo::*>
            ((class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_ffffffffffffffc8.m_ptr,in_stack_ffffffffffffffc0);
  make_setter<std::vector<int,std::allocator<int>>HFParsingInfo::*>
            ((class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_ffffffffffffffc8.m_ptr,in_stack_ffffffffffffffc0);
  objects::class_base::add_property
            (in_RDI,in_RSI,&local_30,(object *)&stack0xffffffffffffffc8,local_28);
  api::object::~object((object *)0x3c026e);
  api::object::~object((object *)0x3c0278);
  return (self *)in_RDI;
}

Assistant:

self& add_property(char const* name, Get fget, Set fset, char const* docstr = 0)
    {
        base::add_property(
            name, this->make_getter(fget), this->make_setter(fset), docstr);
        return *this;
    }